

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O0

void __thiscall
cmFindLibraryCommand::cmFindLibraryCommand(cmFindLibraryCommand *this,cmExecutionStatus *status)

{
  allocator<char> local_39;
  string local_38;
  cmExecutionStatus *local_18;
  cmExecutionStatus *status_local;
  cmFindLibraryCommand *this_local;
  
  local_18 = status;
  status_local = (cmExecutionStatus *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"find_library",&local_39);
  cmFindBase::cmFindBase(&this->super_cmFindBase,&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  (this->super_cmFindBase)._vptr_cmFindBase = (_func_int **)&PTR__cmFindLibraryCommand_00febca8;
  std::__cxx11::string::operator=((string *)&(this->super_cmFindBase).EnvironmentPath,"LIB");
  (this->super_cmFindBase).NamesPerDirAllowed = true;
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmFindBase).VariableDocumentation,"Path to a library.");
  (this->super_cmFindBase).VariableType = FILEPATH;
  return;
}

Assistant:

cmFindLibraryCommand::cmFindLibraryCommand(cmExecutionStatus& status)
  : cmFindBase("find_library", status)
{
  this->EnvironmentPath = "LIB";
  this->NamesPerDirAllowed = true;
  this->VariableDocumentation = "Path to a library.";
  this->VariableType = cmStateEnums::FILEPATH;
}